

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_signal(LIBSSH2_CHANNEL *channel,char *signame,size_t signame_len)

{
  int iVar1;
  uchar *puVar2;
  uchar *puStack_40;
  int rc;
  uchar *s;
  LIBSSH2_SESSION *pLStack_30;
  int retcode;
  LIBSSH2_SESSION *session;
  size_t signame_len_local;
  char *signame_local;
  LIBSSH2_CHANNEL *channel_local;
  
  pLStack_30 = channel->session;
  s._4_4_ = -0xe;
  session = (LIBSSH2_SESSION *)signame_len;
  signame_len_local = (size_t)signame;
  signame_local = (char *)channel;
  if (channel->sendsignal_state == libssh2_NB_state_idle) {
    channel->sendsignal_packet_len = signame_len + 0x14;
    puVar2 = (uchar *)(*pLStack_30->alloc)(channel->sendsignal_packet_len,&pLStack_30->abstract);
    *(uchar **)(signame_local + 0x330) = puVar2;
    if (*(long *)(signame_local + 0x330) == 0) {
      puStack_40 = puVar2;
      iVar1 = _libssh2_error(pLStack_30,-6,"Unable to allocate memory for signal request");
      return iVar1;
    }
    puStack_40 = puVar2 + 1;
    *puVar2 = 'b';
    _libssh2_store_u32(&stack0xffffffffffffffc0,*(uint32_t *)(signame_local + 0x4c));
    _libssh2_store_str(&stack0xffffffffffffffc0,"signal",6);
    *puStack_40 = '\0';
    puStack_40 = puStack_40 + 1;
    _libssh2_store_str(&stack0xffffffffffffffc0,(char *)signame_len_local,(size_t)session);
    signame_local[0x328] = '\x02';
    signame_local[0x329] = '\0';
    signame_local[0x32a] = '\0';
    signame_local[0x32b] = '\0';
  }
  if (*(int *)(signame_local + 0x328) == 2) {
    iVar1 = _libssh2_transport_send
                      (pLStack_30,*(uchar **)(signame_local + 0x330),
                       *(size_t *)(signame_local + 0x338),(uchar *)0x0,0);
    if (iVar1 == -0x25) {
      _libssh2_error(pLStack_30,-0x25,"Would block sending signal request");
      return -0x25;
    }
    if (iVar1 != 0) {
      (*pLStack_30->free)(*(void **)(signame_local + 0x330),&pLStack_30->abstract);
      signame_local[0x328] = '\0';
      signame_local[0x329] = '\0';
      signame_local[0x32a] = '\0';
      signame_local[0x32b] = '\0';
      iVar1 = _libssh2_error(pLStack_30,iVar1,"Unable to send signal packet");
      return iVar1;
    }
    (*pLStack_30->free)(*(void **)(signame_local + 0x330),&pLStack_30->abstract);
    s._4_4_ = 0;
  }
  signame_local[0x328] = '\0';
  signame_local[0x329] = '\0';
  signame_local[0x32a] = '\0';
  signame_local[0x32b] = '\0';
  return s._4_4_;
}

Assistant:

static int channel_signal(LIBSSH2_CHANNEL *channel,
                          const char *signame,
                          size_t signame_len)
{
    LIBSSH2_SESSION *session = channel->session;
    int retcode = LIBSSH2_ERROR_PROTO;

    if(channel->sendsignal_state == libssh2_NB_state_idle) {
        unsigned char *s;

        /* 20 = packet_type(1) + channel(4) +
                signal_len + sizeof(signal) - 1 + want_reply(1) +
                signame_len_len(4) */
        channel->sendsignal_packet_len = 20 + signame_len;

        s = channel->sendsignal_packet =
            LIBSSH2_ALLOC(session, channel->sendsignal_packet_len);
        if(!channel->sendsignal_packet)
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "signal request");

        *(s++) = SSH_MSG_CHANNEL_REQUEST;
        _libssh2_store_u32(&s, channel->remote.id);
        _libssh2_store_str(&s, "signal", sizeof("signal") - 1);
        *(s++) = 0x00;  /* Don't reply */
        _libssh2_store_str(&s, signame, signame_len);

        channel->sendsignal_state = libssh2_NB_state_created;
    }

    if(channel->sendsignal_state == libssh2_NB_state_created) {
        int rc;

        rc = _libssh2_transport_send(session, channel->sendsignal_packet,
                                     channel->sendsignal_packet_len,
                                     NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            _libssh2_error(session, rc, "Would block sending signal request");
            return rc;
        }
        else if(rc) {
            LIBSSH2_FREE(session, channel->sendsignal_packet);
            channel->sendsignal_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc, "Unable to send signal packet");
        }
        LIBSSH2_FREE(session, channel->sendsignal_packet);
        retcode = LIBSSH2_ERROR_NONE;
    }

    channel->sendsignal_state = libssh2_NB_state_idle;

    return retcode;
}